

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O1

int nifti_disp_type_list(int which)

{
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  
  pcVar1 = "ALL";
  if (which == 2) {
    pcVar1 = "NIFTI_TYPE_";
  }
  pcVar2 = "DT_";
  if (which != 1) {
    pcVar2 = pcVar1;
  }
  printf("nifti_type_list entries (%s) :\n  name                    type    nbyper    swapsize\n  ---------------------   ----    ------    --------\n"
         ,pcVar2);
  lVar3 = 0x10;
  do {
    if (((which != 2) && (**(char **)((long)&nifti_type_list[0].type + lVar3) == 'D')) ||
       ((which != 1 && (**(char **)((long)&nifti_type_list[0].type + lVar3) == 'N')))) {
      printf("  %-22s %5d     %3d      %5d\n",
             *(undefined8 *)((long)&nifti_type_list[0].type + lVar3),
             (ulong)*(uint *)((long)&PTR_anon_var_dwarf_392d_00123930 + lVar3),
             (ulong)*(uint *)((long)&PTR_anon_var_dwarf_392d_00123930 + lVar3 + 4),
             (ulong)*(uint *)((long)&PTR_anon_var_dwarf_3938_00123938 + lVar3));
    }
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x418);
  return 0;
}

Assistant:

int nifti_disp_type_list( int which )
{
    const char * style;
    int    tablen = sizeof(nifti_type_list)/sizeof(nifti_type_ele);
    int    lwhich, c;

    if     ( which == 1 ){ lwhich = 1; style = "DT_"; }
    else if( which == 2 ){ lwhich = 2; style = "NIFTI_TYPE_"; }
    else                 { lwhich = 3; style = "ALL"; }

    printf("nifti_type_list entries (%s) :\n"
           "  name                    type    nbyper    swapsize\n"
           "  ---------------------   ----    ------    --------\n", style);

    for( c = 0; c < tablen; c++ )
        if( (lwhich & 1 && nifti_type_list[c].name[0] == 'D')  ||
            (lwhich & 2 && nifti_type_list[c].name[0] == 'N')     )
            printf("  %-22s %5d     %3d      %5d\n",
                   nifti_type_list[c].name,
                   nifti_type_list[c].type,
                   nifti_type_list[c].nbyper,
                   nifti_type_list[c].swapsize);

    return 0;
}